

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_cases.h
# Opt level: O2

bool date::cases_reader_t<2ul,1ul>::
     read<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,date::branch_t<date::character_t<char>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::character_t<char>,date::unsigned_integer_t<short,2u,2u>>>
               (iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos,
               iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end,
               cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
               *fmt)

{
  bool bVar1;
  iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> local_38;
  
  local_38.m_srcIt = pos->m_srcIt;
  local_38.m_srcEnd = pos->m_srcEnd;
  local_38.m_cache._0_4_ = *(undefined4 *)&pos->m_cache;
  local_38.m_cache._4_4_ = *(undefined4 *)((long)&pos->m_cache + 4);
  local_38.m_cacheSize._0_4_ = *(undefined4 *)&pos->m_cacheSize;
  local_38.m_cacheSize._4_4_ = *(undefined4 *)((long)&pos->m_cacheSize + 4);
  local_38.m_position = pos->m_position;
  bVar1 = read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,std::tuple<date::signed_integer_t<short,2u,2u,true>,date::character_t<char>,date::unsigned_integer_t<short,2u,2u>>,0ul,1ul,2ul>
                    ();
  if (!bVar1) {
    iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator=
              (pos,&local_38);
  }
  return bVar1;
}

Assistant:

static bool read(Iterator& pos, const Iterator& end, cases_t<Branches...>& fmt)
    {
        Iterator begin = pos;
        if (read_impl(pos, end, std::get<Count - N>(fmt.branches)))
            return true;
        
        pos = std::move(begin);
        return cases_reader_t<Count, N - 1>::read(pos, end, fmt);
    }